

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

UniValue *
RPCConvertNamedValues
          (string *strMethod,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strParams)

{
  string_view arg_value;
  string_view arg_value_00;
  bool bVar1;
  char *pcVar2;
  CRPCConvertTable *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  UniValue *params;
  string_view value;
  string_view s;
  const_iterator __end1;
  const_iterator __begin1;
  string name;
  UniValue positional_args;
  UniValue *in_stack_fffffffffffffcc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  UniValue *in_stack_fffffffffffffcd8;
  UniValue *this;
  undefined4 in_stack_fffffffffffffce0;
  VType in_stack_fffffffffffffce4;
  undefined4 uVar5;
  UniValue *in_stack_fffffffffffffce8;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  size_t in_stack_fffffffffffffcf0;
  allocator<char> *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  CRPCConvertTable *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  int iVar6;
  char *pcVar7;
  undefined1 local_279 [9];
  char *pcStack_270;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  allocator<char> local_249;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  size_t local_238;
  char *pcStack_230;
  __sv_type local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  UniValue local_208 [5];
  char local_28 [32];
  long local_8;
  
  uVar5 = SUB84(in_RDI,0);
  iVar6 = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar7 = local_28;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  UniValue::UniValue(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                     (string *)in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcc8);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  UniValue::UniValue(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                     (string *)in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcc8);
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(in_stack_fffffffffffffcd0);
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(in_stack_fffffffffffffcd0);
  bVar3._M_str = in_stack_fffffffffffffd00;
  bVar3._M_len = in_stack_fffffffffffffd08;
  bVar4._M_str = (char *)in_stack_fffffffffffffce8;
  bVar4._M_len = in_stack_fffffffffffffcf0;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcd8,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcd0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffcc8);
    local_228 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           bVar4._M_str);
    pcVar2 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::find
                               ((basic_string_view<char,_std::char_traits<char>_> *)bVar3._M_str,
                                bVar3._M_len._7_1_,(size_type)in_stack_fffffffffffffcf8);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      local_238 = local_228._M_len;
      pcStack_230 = local_228._M_str;
      in_stack_fffffffffffffd10 = in_RSI;
      in_stack_fffffffffffffd18 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           UniValue::size(in_stack_fffffffffffffcc8);
      arg_value_00._M_str = pcVar2;
      arg_value_00._M_len = (size_t)pcVar7;
      CRPCConvertTable::ArgToUniValue
                (in_stack_fffffffffffffd10,arg_value_00,(string *)bVar3._M_len,iVar6);
      UniValue::push_back((UniValue *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                          in_stack_fffffffffffffcd8);
      UniValue::~UniValue(in_stack_fffffffffffffcc8);
    }
    else {
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_str,
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         (size_type)in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffcf8 = &local_249;
      local_248 = bVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4._M_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (allocator<char> *)in_stack_fffffffffffffcd8);
      this_00 = (basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_str;
      std::allocator<char>::~allocator(&local_249);
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this_00,CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         (size_type)in_stack_fffffffffffffcf8);
      local_260 = bVar4;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3._M_len);
      arg_value._M_len._4_4_ = iVar6;
      arg_value._M_len._0_4_ = uVar5;
      arg_value._M_str = pcVar7;
      unique0x100008ef = local_260;
      CRPCConvertTable::ArgToUniValue
                (in_stack_fffffffffffffd10,arg_value,(string *)bVar3._M_len,(string *)bVar3._M_str);
      UniValue::pushKV((UniValue *)in_stack_fffffffffffffd10,(string *)bVar3._M_len,
                       (UniValue *)bVar3._M_str);
      UniValue::~UniValue(in_stack_fffffffffffffcc8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcc8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcc8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffcc8);
  }
  bVar1 = UniValue::empty(in_stack_fffffffffffffcc8);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffce4);
  if (!bVar1) {
    this = (UniValue *)local_279;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
               (allocator<char> *)bVar3._M_len);
    UniValue::UniValue(this,local_208);
    UniValue::pushKVEnd((UniValue *)bVar4._M_len,(string *)bVar4._M_str,
                        (UniValue *)CONCAT44(uVar5,in_stack_fffffffffffffce0));
    UniValue::~UniValue(in_stack_fffffffffffffcc8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcc8);
    std::allocator<char>::~allocator((allocator<char> *)local_279);
  }
  UniValue::~UniValue(in_stack_fffffffffffffcc8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue RPCConvertNamedValues(const std::string &strMethod, const std::vector<std::string> &strParams)
{
    UniValue params(UniValue::VOBJ);
    UniValue positional_args{UniValue::VARR};

    for (std::string_view s: strParams) {
        size_t pos = s.find('=');
        if (pos == std::string::npos) {
            positional_args.push_back(rpcCvtTable.ArgToUniValue(s, strMethod, positional_args.size()));
            continue;
        }

        std::string name{s.substr(0, pos)};
        std::string_view value{s.substr(pos+1)};

        // Intentionally overwrite earlier named values with later ones as a
        // convenience for scripts and command line users that want to merge
        // options.
        params.pushKV(name, rpcCvtTable.ArgToUniValue(value, strMethod, name));
    }

    if (!positional_args.empty()) {
        // Use pushKVEnd instead of pushKV to avoid overwriting an explicit
        // "args" value with an implicit one. Let the RPC server handle the
        // request as given.
        params.pushKVEnd("args", std::move(positional_args));
    }

    return params;
}